

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynBase * ParsePostExpressions(ParseContext *ctx,SynBase *node)

{
  LexemeType LVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  SynBase *pSVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Lexeme *pLVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Lexeme *pLVar6;
  char *msg;
  undefined1 uVar7;
  _func_int **pp_Var8;
  SynBase *pSVar9;
  uint uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  IntrusiveList<SynCallArgument> IVar14;
  bool shrBorrow;
  IntrusiveList<SynBase> aliases;
  bool local_59;
  IntrusiveList<SynBase> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
LAB_00215a30:
  do {
    pSVar9 = node;
    while( true ) {
      pLVar6 = ctx->currentLexeme;
      LVar1 = pLVar6->type;
      if (0x2b < (int)LVar1) break;
      if (LVar1 != lex_point) {
        if (LVar1 == lex_inc) {
          ctx->currentLexeme = pLVar6 + 1;
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar4 = (SynBase *)CONCAT44(extraout_var_06,iVar3);
          pLVar5 = ctx->currentLexeme;
          if (pLVar5 <= ctx->firstLexeme) goto LAB_00215eea;
          uVar7 = 1;
        }
        else {
          if (LVar1 != lex_dec) {
            return pSVar9;
          }
          ctx->currentLexeme = pLVar6 + 1;
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar4 = (SynBase *)CONCAT44(extraout_var_05,iVar3);
          pLVar5 = ctx->currentLexeme;
          if (pLVar5 <= ctx->firstLexeme) goto LAB_00215eea;
          uVar7 = 0;
        }
        SynBase::SynBase(pSVar4,0x1c,pLVar6,pLVar5 + -1);
        pSVar4->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e7928;
        pSVar4[1]._vptr_SynBase = (_func_int **)pSVar9;
        *(undefined1 *)&pSVar4[1].typeID = uVar7;
        return pSVar4;
      }
      pLVar5 = pLVar6 + 1;
      ctx->currentLexeme = pLVar5;
      if (pLVar6[1].type == lex_return) {
        pp_Var8 = (_func_int **)pLVar6[1].pos;
        uVar10 = pLVar6[1].length;
LAB_00215c95:
        ctx->currentLexeme = pLVar5 + 1;
LAB_00215ca0:
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar4 = (SynBase *)CONCAT44(extraout_var_02,iVar3);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00215eea;
        pLVar6 = ctx->currentLexeme + -1;
        SynBase::SynBase(pSVar4,4,pLVar6,pLVar6);
        pSVar4->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
        pSVar4[1]._vptr_SynBase = pp_Var8;
        *(char **)&pSVar4[1].typeID = (char *)((long)pp_Var8 + (ulong)uVar10);
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        node = (SynBase *)CONCAT44(extraout_var_03,iVar3);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00215eea;
        SynBase::SynBase(node,0x17,pSVar9->begin,ctx->currentLexeme + -1);
        node->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e78f0;
        node[1]._vptr_SynBase = (_func_int **)pSVar9;
        *(SynBase **)&node[1].typeID = pSVar4;
        goto LAB_00215a30;
      }
      bVar2 = anon_unknown.dwarf_169315::CheckAt
                        (ctx,lex_string,"ERROR: member name expected after \'.\'");
      if (bVar2) {
        pLVar5 = ctx->currentLexeme;
        pp_Var8 = (_func_int **)pLVar5->pos;
        uVar10 = pLVar5->length;
        if (pLVar5->type != lex_none) goto LAB_00215c95;
        goto LAB_00215ca0;
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar4 = (SynBase *)CONCAT44(extraout_var,iVar3);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00215eea;
      pLVar6 = ctx->currentLexeme + -1;
      SynBase::SynBase(pSVar4,0x17,pLVar6,pLVar6);
      pSVar4->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e78f0;
      pSVar4[1]._vptr_SynBase = (_func_int **)pSVar9;
      *(undefined8 *)&pSVar4[1].typeID = 0;
      pSVar9 = pSVar4;
    }
    if (LVar1 == lex_oparen) {
      ctx->currentLexeme = pLVar6 + 1;
      IVar14 = ParseCallArguments(ctx);
      anon_unknown.dwarf_169315::CheckConsume
                (ctx,lex_cparen,"ERROR: \')\' not found after function argument list");
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      node = (SynBase *)CONCAT44(extraout_var_00,iVar3);
      if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_00215eea:
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      SynBase::SynBase(node,0x1a,pLVar6,ctx->currentLexeme + -1);
      node->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e7158;
      node[1]._vptr_SynBase = (_func_int **)pSVar9;
      uVar10 = 0;
      uVar11 = 0;
      uVar12 = 0;
      uVar13 = 0;
LAB_00215e24:
      node[1].typeID = uVar10;
      *(undefined4 *)&node[1].field_0xc = uVar11;
      *(undefined4 *)&node[1].begin = uVar12;
      *(undefined4 *)((long)&node[1].begin + 4) = uVar13;
      node[1].end = (Lexeme *)IVar14.head;
      node[1].pos.begin = (char *)IVar14.tail;
      goto LAB_00215a30;
    }
    if (LVar1 != lex_obracket) {
      if (LVar1 != lex_with) {
        return pSVar9;
      }
      ctx->currentLexeme = pLVar6 + 1;
      local_58.head = (SynBase *)0x0;
      local_58.tail = (SynBase *)0x0;
      anon_unknown.dwarf_169315::CheckConsume
                (ctx,lex_less,"ERROR: \'<\' not found before explicit generic type alias list");
      local_59 = false;
      while (pSVar4 = ParseType(ctx,&local_59,false), pSVar4 != (SynBase *)0x0) {
        IntrusiveList<SynBase>::push_back(&local_58,pSVar4);
        if (ctx->currentLexeme->type != lex_comma) goto LAB_00215d73;
        ctx->currentLexeme = ctx->currentLexeme + 1;
      }
      msg = "ERROR: type name is expected after \',\'";
      if (local_58.head == (SynBase *)0x0) {
        msg = "ERROR: type name is expected after \'with\'";
      }
      anon_unknown.dwarf_169315::Report(ctx,ctx->currentLexeme,msg);
LAB_00215d73:
      anon_unknown.dwarf_169315::CheckConsume
                (ctx,(uint)local_59 * 2 + lex_greater,
                 "ERROR: \'>\' not found after explicit generic type alias list");
      anon_unknown.dwarf_169315::CheckConsume
                (ctx,lex_oparen,"ERROR: \'(\' is expected at this point");
      IVar14 = ParseCallArguments(ctx);
      anon_unknown.dwarf_169315::CheckConsume
                (ctx,lex_cparen,"ERROR: \')\' not found after function argument list");
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      node = (SynBase *)CONCAT44(extraout_var_04,iVar3);
      if (ctx->firstLexeme < ctx->currentLexeme) {
        local_48 = local_58.head;
        uStack_40 = local_58.tail;
        SynBase::SynBase(node,0x1a,pLVar6,ctx->currentLexeme + -1);
        node->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e7158;
        node[1]._vptr_SynBase = (_func_int **)pSVar9;
        uVar10 = (uint)local_48;
        uVar11 = local_48._4_4_;
        uVar12 = (undefined4)uStack_40;
        uVar13 = uStack_40._4_4_;
        goto LAB_00215e24;
      }
      goto LAB_00215eea;
    }
    ctx->currentLexeme = pLVar6 + 1;
    IVar14 = ParseCallArguments(ctx);
    anon_unknown.dwarf_169315::CheckConsume
              (ctx,lex_cbracket,"ERROR: \']\' not found after expression");
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    node = (SynBase *)CONCAT44(extraout_var_01,iVar3);
    if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00215eea;
    SynBase::SynBase(node,0x19,pLVar6,ctx->currentLexeme + -1);
    node->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6a58;
    node[1]._vptr_SynBase = (_func_int **)pSVar9;
    *(IntrusiveList<SynCallArgument> *)&node[1].typeID = IVar14;
  } while( true );
}

Assistant:

SynBase* ParsePostExpressions(ParseContext &ctx, SynBase *node)
{
	while(ctx.At(lex_point) || ctx.At(lex_obracket) || ctx.At(lex_oparen) || ctx.At(lex_with))
	{
		Lexeme *pos = ctx.currentLexeme;

		if(ctx.Consume(lex_point))
		{
			if(ctx.At(lex_return) || CheckAt(ctx, lex_string, "ERROR: member name expected after '.'"))
			{
				InplaceStr member = ctx.Consume();
				SynIdentifier *memberIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), member);

				node = new (ctx.get<SynMemberAccess>()) SynMemberAccess(node->begin, ctx.Previous(), node, memberIdentifier);
			}
			else
			{
				node = new (ctx.get<SynMemberAccess>()) SynMemberAccess(ctx.Previous(), ctx.Previous(), node, NULL);
			}
		}
		else if(ctx.Consume(lex_obracket))
		{
			IntrusiveList<SynCallArgument> arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cbracket, "ERROR: ']' not found after expression");

			node = new (ctx.get<SynArrayIndex>()) SynArrayIndex(pos, ctx.Previous(), node, arguments);
		}
		else if(ctx.Consume(lex_with))
		{
			IntrusiveList<SynBase> aliases;

			CheckConsume(ctx, lex_less, "ERROR: '<' not found before explicit generic type alias list");

			bool shrBorrow = false;

			do
			{
				SynBase *type = ParseType(ctx, &shrBorrow);

				if(!type)
				{
					if(aliases.empty())
						Report(ctx, ctx.Current(), "ERROR: type name is expected after 'with'");
					else
						Report(ctx, ctx.Current(), "ERROR: type name is expected after ','");

					break;
				}

				aliases.push_back(type);
			}
			while(ctx.Consume(lex_comma));

			CheckConsume(ctx, shrBorrow ? lex_shr : lex_greater, "ERROR: '>' not found after explicit generic type alias list");

			CheckConsume(ctx, lex_oparen, "ERROR: '(' is expected at this point");

			IntrusiveList<SynCallArgument> arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function argument list");

			node = new (ctx.get<SynFunctionCall>()) SynFunctionCall(pos, ctx.Previous(), node, aliases, arguments);
		}
		else if(ctx.Consume(lex_oparen))
		{
			IntrusiveList<SynBase> aliases;
			IntrusiveList<SynCallArgument> arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function argument list");

			node = new (ctx.get<SynFunctionCall>()) SynFunctionCall(pos, ctx.Previous(), node, aliases, arguments);
		}
		else
		{
			Stop(ctx, ctx.Current(), "ERROR: not implemented");
		}
	}

	Lexeme *pos = ctx.currentLexeme;

	if(ctx.Consume(lex_inc))
		node = new (ctx.get<SynPostModify>()) SynPostModify(pos, ctx.Previous(), node, true);
	else if(ctx.Consume(lex_dec))
		node = new (ctx.get<SynPostModify>()) SynPostModify(pos, ctx.Previous(), node, false);

	return node;
}